

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<true>::nameSpace(TC_parser<true> *this)

{
  char cVar1;
  example *this_00;
  char *pcVar2;
  uint64_t uVar3;
  
  this->cur_channel_v = 1.0;
  this->index = '\0';
  this->new_index = false;
  this->anon = 0;
  pcVar2 = this->reading_head;
  cVar1 = *pcVar2;
  if ((((cVar1 == '\t') || (cVar1 == ' ')) || (pcVar2 == this->endLine)) || (cVar1 == '|')) {
LAB_00138000:
    this->index = ' ';
    if ((this->ae->super_example_predict).feature_space[0x20].values._end ==
        (this->ae->super_example_predict).feature_space[0x20].values._begin) {
      this->new_index = true;
    }
    free(this->base);
    pcVar2 = calloc_or_throw<char>(2);
    this->base = pcVar2;
    *pcVar2 = ' ';
    this->base[1] = '\0';
    if ((ulong)this->hash_seed == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = uniform_hash("",0,(ulong)this->hash_seed);
    }
    this->channel_hash = uVar3;
  }
  else {
    if (cVar1 == ':') {
      parserWarning(this,"malformed example! \'|\',String,space, or EOL expected after : \"",
                    this->beginLine,pcVar2,"\"");
      goto LAB_00138065;
    }
    if (cVar1 == '\r') goto LAB_00138000;
    nameSpaceInfo(this);
  }
  listFeatures(this);
LAB_00138065:
  if ((this->new_index == true) &&
     (this_00 = this->ae,
     (this_00->super_example_predict).feature_space[this->index].values._end !=
     (this_00->super_example_predict).feature_space[this->index].values._begin)) {
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this_00,&this->index);
    return;
  }
  return;
}

Assistant:

inline void nameSpace()
  {
    cur_channel_v = 1.0;
    index = 0;
    new_index = false;
    anon = 0;
    if (*reading_head == ' ' || *reading_head == '\t' || reading_head == endLine || *reading_head == '|' ||
        *reading_head == '\r')
    {
      // NameSpace --> ListFeatures
      index = (unsigned char)' ';
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      if (audit)
      {
        if (base != nullptr)
          free(base);
        base = calloc_or_throw<char>(2);
        base[0] = ' ';
        base[1] = '\0';
      }
      channel_hash = this->hash_seed == 0 ? 0 : uniform_hash("", 0, this->hash_seed);
      listFeatures();
    }
    else if (*reading_head != ':')
    {
      // NameSpace --> NameSpaceInfo ListFeatures
      nameSpaceInfo();
      listFeatures();
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|',String,space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
    if (new_index && ae->feature_space[index].size() > 0)
      ae->indices.push_back(index);
  }